

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O2

_Bool Open_JTalk_load_dic(Open_JTalk *open_jtalk,char *dn_mecab)

{
  int iVar1;
  
  if (dn_mecab == (char *)0x0 || open_jtalk == (Open_JTalk *)0x0) {
    return false;
  }
  if (*dn_mecab != '\0') {
    JPCommon_refresh(&open_jtalk->jpcommon);
    NJD_refresh(&open_jtalk->njd);
    Mecab_refresh(&open_jtalk->mecab);
    iVar1 = Mecab_load(&open_jtalk->mecab,dn_mecab);
    if (iVar1 == 1) {
      return true;
    }
    Open_JTalk_clear(open_jtalk);
  }
  return false;
}

Assistant:

bool Open_JTalk_load_dic(Open_JTalk *open_jtalk, char *dn_mecab)
{
	if (open_jtalk == NULL || dn_mecab == NULL || strlen(dn_mecab) == 0)
	{
		return false;
	}

	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);
	Mecab_refresh(&open_jtalk->mecab);

	if (Mecab_load(&open_jtalk->mecab, dn_mecab) != true)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	return true;
}